

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bandpre.c
# Opt level: O3

int ARKBandPrecSetup(sunrealtype t,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
                    void *bp_data)

{
  ARKodeMem ark_mem;
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  code *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  sunrealtype *psVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  char *msgfmt;
  long lVar21;
  long j;
  bool bVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double local_c8;
  long local_b8;
  double local_b0;
  long local_a0;
  
  ark_mem = *(ARKodeMem *)((long)bp_data + 0x48);
  if (jok == 0) {
    *jcurPtr = 1;
    iVar6 = SUNMatZero(*(undefined8 *)((long)bp_data + 0x18));
    if (iVar6 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar6 = 0x165;
      goto LAB_0012238c;
    }
    if (iVar6 != 0) {
      return 1;
    }
    uVar1 = *(undefined8 *)((long)bp_data + 0x30);
    uVar2 = *(undefined8 *)((long)bp_data + 0x38);
    lVar3 = *(long *)((long)bp_data + 0x48);
    pcVar7 = (code *)(**(code **)(lVar3 + 0x130))(lVar3);
    if (pcVar7 == (code *)0x0) {
LAB_0012233a:
      msgfmt = "The right-hand side routine failed in an unrecoverable manner.";
      iVar6 = 0x16e;
      goto LAB_0012238c;
    }
    lVar8 = N_VGetArrayPointer(*(undefined8 *)(lVar3 + 0x210));
    lVar9 = N_VGetArrayPointer(fy);
    lVar10 = N_VGetArrayPointer(uVar1);
    lVar11 = N_VGetArrayPointer(y);
    lVar12 = N_VGetArrayPointer(uVar2);
    if (*(int *)(lVar3 + 0x80) == 0) {
      local_b8 = 0;
    }
    else {
      local_b8 = N_VGetArrayPointer(*(undefined8 *)(lVar3 + 0x270));
    }
    local_b0 = 1.0;
    N_VScale(y,uVar2);
    dVar23 = *(double *)(lVar3 + 8);
    local_c8 = 0.0;
    if (0.0 < dVar23) {
      if (dVar23 < 0.0) {
        local_c8 = sqrt(dVar23);
      }
      else {
        local_c8 = SQRT(dVar23);
      }
    }
    dVar23 = (double)N_VWrmsNorm(fy,*(undefined8 *)(lVar3 + 0x218));
    lVar15 = *bp_data;
    if ((dVar23 != 0.0) || (NAN(dVar23))) {
      local_b0 = dVar23 * (double)lVar15 *
                          ABS(*(double *)(lVar3 + 0x2a0)) * 1000.0 * *(double *)(lVar3 + 8);
    }
    lVar4 = *(long *)((long)bp_data + 8);
    lVar5 = *(long *)((long)bp_data + 0x10);
    lVar21 = lVar4 + lVar5 + 1;
    lVar19 = lVar15;
    if (lVar21 < lVar15) {
      lVar19 = lVar21;
    }
    if (0 < lVar19) {
      local_a0 = 0;
      lVar13 = 1;
      do {
        j = lVar13 + -1;
        if (lVar13 <= lVar15) {
          iVar6 = *(int *)(lVar3 + 0x80);
          lVar16 = j;
          do {
            dVar23 = *(double *)(lVar11 + lVar16 * 8);
            dVar25 = local_b0 / *(double *)(lVar8 + lVar16 * 8);
            dVar24 = ABS(dVar23) * local_c8;
            if (ABS(dVar23) * local_c8 <= dVar25) {
              dVar24 = dVar25;
            }
            if (iVar6 != 0) {
              dVar25 = *(double *)(local_b8 + lVar16 * 8);
              dVar26 = ABS(dVar25);
              if ((dVar26 != 1.0) || (NAN(dVar26))) {
                if ((dVar26 == 2.0) && ((!NAN(dVar26) && ((dVar23 + dVar24) * dVar25 <= 0.0))))
                goto LAB_00122137;
              }
              else if ((dVar23 + dVar24) * dVar25 < 0.0) {
LAB_00122137:
                dVar24 = -dVar24;
              }
            }
            *(double *)(lVar12 + lVar16 * 8) = dVar24 + *(double *)(lVar12 + lVar16 * 8);
            lVar16 = lVar16 + lVar21;
          } while (lVar16 < lVar15);
        }
        iVar6 = (*pcVar7)(t,uVar2,uVar1,*(undefined8 *)(lVar3 + 0x10));
        *(long *)((long)bp_data + 0x40) = *(long *)((long)bp_data + 0x40) + 1;
        if (iVar6 != 0) {
          if (-1 < iVar6) {
            return 1;
          }
          goto LAB_0012233a;
        }
        lVar15 = *bp_data;
        lVar16 = local_a0;
        if (lVar13 <= lVar15) {
          do {
            dVar23 = *(double *)(lVar11 + j * 8);
            *(double *)(lVar12 + j * 8) = dVar23;
            psVar14 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bp_data + 0x18),j);
            dVar25 = local_b0 / *(double *)(lVar8 + j * 8);
            dVar24 = ABS(*(double *)(lVar11 + j * 8)) * local_c8;
            if (dVar24 <= dVar25) {
              dVar24 = dVar25;
            }
            if (*(int *)(lVar3 + 0x80) != 0) {
              dVar25 = *(double *)(local_b8 + j * 8);
              dVar26 = ABS(dVar25);
              if ((dVar26 != 1.0) || (NAN(dVar26))) {
                if ((dVar26 == 2.0) && ((!NAN(dVar26) && ((dVar23 + dVar24) * dVar25 <= 0.0))))
                goto LAB_00122261;
              }
              else if ((dVar23 + dVar24) * dVar25 < 0.0) {
LAB_00122261:
                dVar24 = -dVar24;
              }
            }
            lVar17 = j - *(long *)((long)bp_data + 0x10);
            lVar20 = 0;
            if (0 < lVar17) {
              lVar20 = lVar17;
            }
            lVar15 = *bp_data;
            lVar18 = *(long *)((long)bp_data + 8) + j;
            if (lVar15 + -1 <= lVar18) {
              lVar18 = lVar15 + -1;
            }
            if (lVar20 <= lVar18) {
              if (lVar17 < 1) {
                lVar17 = 0;
              }
              lVar17 = lVar17 + -1;
              do {
                *(double *)((long)psVar14 + lVar17 * 8 + lVar16 + 8) =
                     (*(double *)(lVar10 + 8 + lVar17 * 8) - *(double *)(lVar9 + 8 + lVar17 * 8)) *
                     (1.0 / dVar24);
                lVar17 = lVar17 + 1;
              } while (lVar17 < lVar18);
            }
            j = j + lVar21;
            lVar16 = lVar16 + ~(lVar4 + lVar5) * 8;
          } while (j < lVar15);
        }
        local_a0 = local_a0 + -8;
        bVar22 = lVar13 != lVar19;
        lVar13 = lVar13 + 1;
      } while (bVar22);
    }
    iVar6 = SUNMatCopy(*(undefined8 *)((long)bp_data + 0x18),*(undefined8 *)((long)bp_data + 0x20));
    if (iVar6 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar6 = 0x177;
      goto LAB_0012238c;
    }
  }
  else {
    *jcurPtr = 0;
    iVar6 = SUNMatCopy(*(undefined8 *)((long)bp_data + 0x18),*(undefined8 *)((long)bp_data + 0x20));
    if (iVar6 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar6 = 0x158;
      goto LAB_0012238c;
    }
  }
  if (iVar6 != 0) {
    return 1;
  }
  iVar6 = SUNMatScaleAddI(-gamma,*(undefined8 *)((long)bp_data + 0x20));
  if (iVar6 == 0) {
    iVar6 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bp_data + 0x28),
                                *(SUNMatrix *)((long)bp_data + 0x20));
    return iVar6;
  }
  msgfmt = "An error arose from a SUNBandMatrix routine.";
  iVar6 = 0x182;
LAB_0012238c:
  arkProcessError(ark_mem,-1,iVar6,"ARKBandPrecSetup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                  ,msgfmt);
  return -1;
}

Assistant:

static int ARKBandPrecSetup(sunrealtype t, N_Vector y, N_Vector fy,
                            sunbooleantype jok, sunbooleantype* jcurPtr,
                            sunrealtype gamma, void* bp_data)
{
  ARKBandPrecData pdata;
  ARKodeMem ark_mem;
  int retval;

  /* Assume matrix and lpivots have already been allocated. */
  pdata = (ARKBandPrecData)bp_data;

  ark_mem = (ARKodeMem)pdata->arkode_mem;

  if (jok)
  {
    /* If jok = SUNTRUE, use saved copy of J. */
    *jcurPtr = SUNFALSE;
    retval   = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }
  else
  {
    /* If jok = SUNFALSE, call ARKBandPDQJac for new J value. */
    *jcurPtr = SUNTRUE;
    retval   = SUNMatZero(pdata->savedJ);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = ARKBandPDQJac(pdata, t, y, fy, pdata->tmp1, pdata->tmp2);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_RHSFUNC_FAILED);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }

  /* Scale and add identity to get savedP = I - gamma*J. */
  retval = SUNMatScaleAddI(-gamma, pdata->savedP);
  if (retval)
  {
    arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                    MSG_BP_SUNMAT_FAIL);
    return (-1);
  }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->savedP);
  return (retval);
}